

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::OrthographicCamera::GenerateRayDifferential
          (OrthographicCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> t;
  Point3<float> p;
  Vector3<float> v;
  Vector3<float> v_00;
  Point3<float> p_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Point3<float> p_01;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Tuple3<pbrt::Vector3,_float> t_00;
  Tuple3<pbrt::Vector3,_float> t_01;
  Vector3<float> v_05;
  Vector3<float> v_06;
  RayDifferential *in_RSI;
  Tuple2<pbrt::Point2,_float> in_RDI;
  Float time;
  undefined1 auVar21 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Point3<float> PVar22;
  Point3f PVar23;
  Vector3<float> VVar24;
  Point3f pFocus_1;
  Float ft_1;
  Point2f pLens_1;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  RayDifferential ray;
  Point3f pCamera;
  Point3f pFilm;
  float in_stack_fffffffffffffa58;
  Float in_stack_fffffffffffffa5c;
  CameraBase *in_stack_fffffffffffffa60;
  float in_stack_fffffffffffffa68;
  float in_stack_fffffffffffffa6c;
  float s;
  undefined4 in_stack_fffffffffffffa80;
  float fVar25;
  undefined4 in_stack_fffffffffffffa84;
  undefined4 uVar26;
  float in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined8 *puVar27;
  float in_stack_fffffffffffffa90;
  Tuple2<pbrt::Point2,_float> TVar28;
  undefined4 in_stack_fffffffffffffaa8;
  Float t_02;
  Ray *this_00;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffad8;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined8 in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc08;
  Float local_3e4 [2];
  float local_3dc;
  Float local_2ac [11] [4];
  undefined8 local_1f0;
  float local_1e8;
  float local_1e4;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  Float local_1c0 [2];
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  Float local_190 [2];
  Float local_188;
  Float local_180 [2];
  Float local_178;
  undefined8 local_170;
  float local_168;
  Float local_160 [2];
  float local_158;
  Float local_154 [2];
  Float local_14c;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  float local_12c;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_100;
  Float local_f8 [2];
  float local_f0;
  undefined8 local_dc;
  undefined4 local_d4;
  Float local_d0 [2];
  float local_c8;
  Float local_c0;
  Float FStack_bc;
  Float local_b8;
  Float local_b4;
  Float FStack_b0;
  float local_ac;
  undefined1 local_98;
  undefined8 local_94;
  float local_8c;
  undefined8 local_88;
  float local_80;
  Float local_7c;
  Float FStack_78;
  float local_74;
  Float local_70;
  Float FStack_6c;
  float local_68;
  undefined8 local_60;
  float local_58;
  Float local_50;
  Float FStack_4c;
  Float local_48;
  Float local_40;
  Float FStack_3c;
  Float local_38;
  undefined8 local_30;
  float local_28;
  Float local_24;
  Float FStack_20;
  Float local_1c;
  undefined1 auVar1 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  this_00 = (Ray *)&stack0x00000008;
  t_02 = 0.0;
  TVar28 = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
             in_stack_fffffffffffffa58,0.0);
  local_38 = local_1c;
  local_40 = local_24;
  FStack_3c = FStack_20;
  local_48 = local_1c;
  local_50 = local_24;
  FStack_4c = FStack_20;
  auVar21 = ZEXT856(0);
  PVar22.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc08;
  PVar22.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc00;
  PVar22.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
  PVar22 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                      PVar22);
  local_c8 = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar21;
  local_d0 = (Float  [2])vmovlpd_avx(auVar1._0_16_);
  local_60 = local_d0;
  local_58 = local_c8;
  local_30 = local_d0;
  local_28 = local_c8;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
             in_stack_fffffffffffffa58,0.0);
  time = CameraBase::SampleTime(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
  Medium::Medium((Medium *)in_stack_fffffffffffffa60,
                 (Medium *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  local_f0 = local_c8;
  local_f8[0] = local_d0[0];
  local_f8[1] = local_d0[1];
  local_100 = local_d4;
  local_108 = local_dc;
  RayDifferential::RayDifferential
            (in_RSI,(Point3f)in_stack_fffffffffffffaf8,(Vector3f)in_stack_fffffffffffffad8,time,
             (Medium *)this_00);
  if (0.0 < in_RSI[0xe].ryOrigin.super_Tuple3<pbrt::Point3,_float>.z) {
    local_128 = *(undefined8 *)&(this_00->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar2._0_8_ = SampleUniformDiskConcentric(TVar28);
    auVar2._8_56_ = extraout_var;
    local_120 = vmovlpd_avx(auVar2._0_16_);
    t.y = in_stack_fffffffffffffa5c;
    t.x = in_stack_fffffffffffffa58;
    local_118 = local_120;
    auVar3._0_8_ = pbrt::operator*(0.0,t);
    auVar3._8_56_ = extraout_var_00;
    local_110 = vmovlpd_avx(auVar3._0_16_);
    local_12c = in_RSI[0xe].rxDirection.super_Tuple3<pbrt::Vector3,_float>.x / local_ac;
    auVar21 = (undefined1  [56])0x0;
    PVar23 = Ray::operator()(this_00,t_02);
    local_140 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar21;
    local_148 = vmovlpd_avx(auVar4._0_16_);
    local_138 = local_148;
    local_130 = local_140;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa58,0.0);
    local_b8 = local_14c;
    local_c0 = local_154[0];
    FStack_bc = local_154[1];
    local_178 = local_14c;
    local_180[0] = local_154[0];
    local_180[1] = local_154[1];
    local_188 = local_14c;
    local_190[0] = local_154[0];
    local_190[1] = local_154[1];
    auVar21 = ZEXT856(0);
    p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffa84;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffa80;
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa88;
    VVar24 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),p);
    local_1a8 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar21;
    local_1b0 = vmovlpd_avx(auVar5._0_16_);
    auVar21 = ZEXT856(0);
    VVar24.super_Tuple3<pbrt::Vector3,_float>.y = t_02;
    VVar24.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffaa8;
    VVar24.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(this_00,0);
    local_1a0 = local_1b0;
    local_198 = local_1a8;
    local_170 = local_1b0;
    local_168 = local_1a8;
    VVar24 = Normalize<float>(VVar24);
    local_1b8 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar21;
    local_1c0 = (Float  [2])vmovlpd_avx(auVar6._0_16_);
    local_160 = local_1c0;
    local_158 = local_1b8;
    _local_b4 = local_1c0;
    local_ac = local_1b8;
  }
  if (in_RSI[0xe].ryOrigin.super_Tuple3<pbrt::Point3,_float>.z <= 0.0) {
    auVar21 = ZEXT856(0);
    in_stack_fffffffffffffa60 = (CameraBase *)&stack0xffffffffffffff40;
    v_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa84;
    v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa80;
    v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa88;
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v_03);
    local_8c = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar21;
    local_94 = vmovlpd_avx(auVar19._0_16_);
    auVar21 = ZEXT856(0);
    v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa84;
    v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa80;
    v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa88;
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v_04);
    local_80 = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar20._8_56_ = auVar21;
    local_88 = vmovlpd_avx(auVar20._0_16_);
    local_70 = local_b4;
    FStack_6c = FStack_b0;
    local_68 = local_ac;
    local_7c = local_b4;
    FStack_78 = FStack_b0;
    local_74 = local_ac;
  }
  else {
    in_stack_fffffffffffffa68 = in_RSI[0xe].ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
    local_1e0 = *(undefined8 *)&(this_00->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = SampleUniformDiskConcentric(TVar28);
    auVar7._8_56_ = extraout_var_01;
    local_1d8 = vmovlpd_avx(auVar7._0_16_);
    TVar28.y = in_stack_fffffffffffffa5c;
    TVar28.x = in_stack_fffffffffffffa58;
    local_1d0 = local_1d8;
    auVar8._0_8_ = pbrt::operator*(0.0,TVar28);
    auVar8._8_56_ = extraout_var_02;
    local_1c8 = vmovlpd_avx(auVar8._0_16_);
    local_1e4 = in_RSI[0xe].rxDirection.super_Tuple3<pbrt::Vector3,_float>.x / local_ac;
    auVar21 = ZEXT856(0);
    s = (float)((ulong)&stack0xffffffffffffffd0 >> 0x20);
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa84;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa80;
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa88;
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v);
    auVar9._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar21;
    vmovlpd_avx(auVar9._0_16_);
    uVar26 = 0;
    in_stack_fffffffffffffa6c = local_1e4;
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa58,0.0);
    auVar21 = (undefined1  [56])0x0;
    t_00.y = (float)in_stack_fffffffffffffa8c;
    t_00.x = in_stack_fffffffffffffa88;
    t_00.z = in_stack_fffffffffffffa90;
    VVar24 = pbrt::operator*(s,t_00);
    auVar10._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar21;
    vmovlpd_avx(auVar10._0_16_);
    auVar21 = ZEXT856(0);
    v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar26;
    v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa80;
    v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa88;
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v_00);
    local_1e8 = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar21;
    local_1f0 = vmovlpd_avx(auVar11._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa58,0.0);
    local_8c = local_2ac[0][2];
    local_94 = local_2ac[0]._0_8_;
    auVar21 = ZEXT856(0);
    puVar27 = &local_1f0;
    p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar26;
    p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffa80;
    p_00.super_Tuple3<pbrt::Point3,_float>.z = SUB84(puVar27,0);
    VVar24 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),p_00);
    auVar12._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar21;
    vmovlpd_avx(auVar12._0_16_);
    auVar21 = ZEXT856(0);
    v_05.super_Tuple3<pbrt::Vector3,_float>.y = t_02;
    v_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffaa8;
    v_05.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(this_00,0);
    VVar24 = Normalize<float>(v_05);
    local_74 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar21;
    _local_7c = vmovlpd_avx(auVar13._0_16_);
    auVar21 = ZEXT856(0);
    v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar26;
    v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa80;
    v_01.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(puVar27,0);
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v_01);
    auVar14._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar21;
    vmovlpd_avx(auVar14._0_16_);
    fVar25 = local_1e4;
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa58,0.0);
    auVar21 = (undefined1  [56])0x0;
    t_01.z = in_stack_fffffffffffffa90;
    t_01._0_8_ = puVar27;
    VVar24 = pbrt::operator*(s,t_01);
    auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar21;
    vmovlpd_avx(auVar15._0_16_);
    auVar21 = ZEXT856(0);
    v_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar26;
    v_02.super_Tuple3<pbrt::Vector3,_float>.x = fVar25;
    v_02.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(puVar27,0);
    PVar22 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v_02);
    local_1e8 = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar21;
    local_1f0 = vmovlpd_avx(auVar16._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa58,0.0);
    local_80 = local_3dc;
    local_88 = local_3e4;
    auVar21 = ZEXT856(0);
    p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar26;
    p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar25;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = SUB84(puVar27,0);
    VVar24 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),p_01);
    auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar21;
    vmovlpd_avx(auVar17._0_16_);
    auVar21 = ZEXT856(0);
    v_06.super_Tuple3<pbrt::Vector3,_float>.y = t_02;
    v_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffaa8;
    v_06.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(this_00,0);
    VVar24 = Normalize<float>(v_06);
    local_68 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar21;
    _local_70 = vmovlpd_avx(auVar18._0_16_);
  }
  local_98 = 1;
  CameraBase::RenderFromCamera
            ((CameraBase *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (RayDifferential *)in_stack_fffffffffffffa60);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
  pstd::optional<pbrt::CameraRayDifferential>::optional
            ((optional<pbrt::CameraRayDifferential> *)in_stack_fffffffffffffa60,
             (CameraRayDifferential *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
  ;
  return (optional<pbrt::CameraRayDifferential> *)in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRayDifferential> OrthographicCamera::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute main orthographic viewing ray
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    RayDifferential ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute ray differentials for _OrthographicCamera_
    if (lensRadius > 0) {
        // Compute _OrthographicCamera_ ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = pCamera + dxCamera + (ft * Vector3f(0, 0, 1));
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        pFocus = pCamera + dyCamera + (ft * Vector3f(0, 0, 1));
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.o + dxCamera;
        ray.ryOrigin = ray.o + dyCamera;
        ray.rxDirection = ray.ryDirection = ray.d;
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}